

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

bool ndiGetBX2HandleAveragingEnabled(ndicapi *pol,int portHandle)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = pol->Bx2HandleCount;
  uVar2 = 0;
  if ((long)(int)uVar1 < 1) {
LAB_0010a627:
    if ((uint)uVar2 != uVar1) {
      return pol->Bx2HandleAveragingEnabled[uVar2 & 0xffffffff];
    }
  }
  else {
    do {
      if ((uint)pol->Bx2Handles[uVar2] == portHandle) goto LAB_0010a627;
      uVar2 = uVar2 + 1;
    } while ((long)(int)uVar1 != uVar2);
  }
  return false;
}

Assistant:

ndicapiExport bool ndiGetBX2HandleAveragingEnabled(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->Bx2HandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->Bx2Handles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->Bx2HandleAveragingEnabled[i];
}